

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O0

void mwStatistics(int level)

{
  char *local_18;
  int local_c;
  int level_local;
  
  mwAutoInit();
  local_c = level;
  if (level < 0) {
    local_c = 0;
  }
  if (mwStatLevel != local_c) {
    if (local_c < 1) {
      local_18 = "global";
    }
    else {
      local_18 = "line";
      if (local_c < 2) {
        local_18 = "module";
      }
    }
    mwWrite("statistics: now collecting on a %s basis\n",local_18);
    mwStatLevel = local_c;
  }
  return;
}

Assistant:

void mwStatistics(int level)
{
	mwAutoInit();
	if (level < 0) {
		level = 0;
	}
	if (mwStatLevel != level) {
		mwWrite("statistics: now collecting on a %s basis\n",
				level < 1 ? "global" : (level < 2 ? "module" : "line"));
		mwStatLevel = level;
	}
}